

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<bool,_bool>::streamReconstructedExpression
          (BinaryExpr<bool,_bool> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  string *in_R9;
  StringRef op;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  uVar3 = (ulong)(byte)(this->super_ITransientExpression).field_0xa;
  pcVar2 = "tmpl.is_valid() == false";
  pcVar1 = "tmpl.is_valid() == false";
  if (uVar3 != 0) {
    pcVar1 = "tmpl.is_valid() == true";
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,pcVar1 + 0x13,pcVar1 + 0x13 + (uVar3 ^ 5));
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  if ((ulong)this->m_rhs != 0) {
    pcVar2 = "tmpl.is_valid() == true";
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,pcVar2 + 0x13,pcVar2 + 0x13 + ((ulong)this->m_rhs ^ 5));
  op.m_size = (size_type)local_50;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_70,lhs,op,in_R9);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }